

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

string * __thiscall
google::protobuf::Reflection::GetString_abi_cxx11_
          (string *__return_storage_ptr__,Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  int number;
  CppStringType CVar3;
  Reflection *pRVar4;
  Descriptor *actual;
  Descriptor *pDVar5;
  ExtensionSet *this_00;
  Cord **ppCVar6;
  Cord *this_01;
  InlinedStringField *this_02;
  MicroString *this_03;
  string *psVar7;
  allocator<char> local_81;
  string_view local_80;
  ArenaStringPtr *local_70;
  ArenaStringPtr *str;
  string_view local_60 [2];
  allocator<char> local_39;
  string_view local_38;
  FieldDescriptor *local_28;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  local_28 = field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  this_local = (Reflection *)__return_storage_ptr__;
  pRVar4 = Message::GetReflection(message);
  if (this != pRVar4) {
    pDVar5 = this->descriptor_;
    actual = Message::GetDescriptor((Message *)field_local);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar5,actual,local_28,"GetString");
  }
  pDVar5 = FieldDescriptor::containing_type(local_28);
  if (pDVar5 != this->descriptor_) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,local_28,"GetString","Field does not match message type.");
  }
  bVar1 = FieldDescriptor::is_repeated(local_28);
  if (bVar1) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,local_28,"GetString",
               "Field is repeated; the method requires a singular field.");
  }
  CVar2 = FieldDescriptor::cpp_type(local_28);
  if (CVar2 != CPPTYPE_STRING) {
    anon_unknown_6::ReportReflectionUsageTypeError
              (this->descriptor_,local_28,"GetString",CPPTYPE_STRING);
  }
  bVar1 = FieldDescriptor::is_extension(local_28);
  if (bVar1) {
    this_00 = GetExtensionSet(this,(Message *)field_local);
    number = FieldDescriptor::number(local_28);
    psVar7 = internal::DefaultValueStringAsString_abi_cxx11_(local_28);
    psVar7 = internal::ExtensionSet::GetString(this_00,number,psVar7);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar7);
  }
  else {
    bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,local_28);
    if ((!bVar1) || (bVar1 = HasOneofField(this,(Message *)field_local,local_28), bVar1)) {
      CVar3 = FieldDescriptor::cpp_string_type(local_28);
      if (CVar3 != kView) {
        if (CVar3 == kCord) {
          bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,local_28);
          if (!bVar1) {
            this_01 = GetField<absl::lts_20250127::Cord>(this,(Message *)field_local,local_28);
            absl::lts_20250127::Cord::operator_cast_to_string(__return_storage_ptr__,this_01);
            return __return_storage_ptr__;
          }
          ppCVar6 = GetField<absl::lts_20250127::Cord*>(this,(Message *)field_local,local_28);
          absl::lts_20250127::Cord::operator_cast_to_string(__return_storage_ptr__,*ppCVar6);
          return __return_storage_ptr__;
        }
        if (CVar3 != kString) {
          internal::Unreachable
                    ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                     ,0x78b);
        }
      }
      bVar1 = IsInlined(this,local_28);
      if (bVar1) {
        this_02 = GetField<google::protobuf::internal::InlinedStringField>
                            (this,(Message *)field_local,local_28);
        psVar7 = internal::InlinedStringField::GetNoArena_abi_cxx11_(this_02);
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar7);
      }
      else {
        bVar1 = IsMicroString(this,local_28);
        if (bVar1) {
          this_03 = GetField<google::protobuf::internal::MicroString>
                              (this,(Message *)field_local,local_28);
          local_60[0] = internal::MicroString::Get(this_03);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)__return_storage_ptr__,local_60,(allocator<char> *)((long)&str + 7));
          std::allocator<char>::~allocator((allocator<char> *)((long)&str + 7));
        }
        else {
          local_70 = GetField<google::protobuf::internal::ArenaStringPtr>
                               (this,(Message *)field_local,local_28);
          bVar1 = internal::ArenaStringPtr::IsDefault(local_70);
          if (bVar1) {
            local_80 = FieldDescriptor::default_value_string(local_28);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                      ((string *)__return_storage_ptr__,&local_80,&local_81);
            std::allocator<char>::~allocator(&local_81);
          }
          else {
            psVar7 = internal::ArenaStringPtr::Get_abi_cxx11_(local_70);
            std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar7);
          }
        }
      }
    }
    else {
      local_38 = FieldDescriptor::default_value_string(local_28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)__return_storage_ptr__,&local_38,&local_39);
      std::allocator<char>::~allocator(&local_39);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Reflection::GetString(const Message& message,
                                  const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(GetString, SINGULAR, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetString(
        field->number(), internal::DefaultValueStringAsString(field));
  } else {
    if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
      return std::string(field->default_value_string());
    }
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        if (schema_.InRealOneof(field)) {
          return std::string(*GetField<absl::Cord*>(message, field));
        } else {
          return std::string(GetField<absl::Cord>(message, field));
        }
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString:
        if (IsInlined(field)) {
          return GetField<InlinedStringField>(message, field).GetNoArena();
        } else if (IsMicroString(field)) {
          return std::string(GetField<MicroString>(message, field).Get());
        } else {
          const auto& str = GetField<ArenaStringPtr>(message, field);
          return str.IsDefault() ? std::string(field->default_value_string())
                                 : str.Get();
        }
    }
    internal::Unreachable();
  }
}